

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::StopTcpConnection(RealTrafficConnection *this)

{
  bool bVar1;
  id __x;
  id __y;
  thread *in_RDI;
  TCPConnection *in_stack_ffffffffffffffe0;
  
  *(undefined4 *)&in_RDI[0xfb]._M_id._M_thread = 3;
  XPMP2::TCPConnection::Close(in_stack_ffffffffffffffe0);
  __x = std::this_thread::get_id();
  __y = std::thread::get_id(in_RDI + 0xee);
  bVar1 = std::operator!=(__x,__y);
  if (bVar1) {
    bVar1 = std::thread::joinable((thread *)in_stack_ffffffffffffffe0);
    if (bVar1) {
      std::thread::join();
    }
    memset(&stack0xffffffffffffffe0,0,8);
    std::thread::thread((thread *)0x224e9d);
    std::thread::operator=((thread *)in_stack_ffffffffffffffe0,in_RDI);
    std::thread::~thread((thread *)0x224ebc);
    *(undefined4 *)&in_RDI[0xfb]._M_id._M_thread = 0;
  }
  return;
}

Assistant:

void RealTrafficConnection::StopTcpConnection ()
{
    // close all connections, this will also break out of all
    // blocking calls for receiving message and hence terminate the threads
    eTcpThrStatus = THR_STOP;
    tcpPosSender.Close();
    
    // wait for threads to finish (if I'm not myself this thread...)
    if (std::this_thread::get_id() != thrTcpServer.get_id()) {
        if (thrTcpServer.joinable())
            thrTcpServer.join();
        thrTcpServer = std::thread();
        eTcpThrStatus = THR_NONE;
    }
}